

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O0

lzma_ret lzma_stream_encoder(lzma_stream *strm,lzma_filter *filters,lzma_check check)

{
  lzma_ret ret__1;
  lzma_ret ret_;
  lzma_check check_local;
  lzma_filter *filters_local;
  lzma_stream *strm_local;
  
  strm_local._4_4_ = lzma_strm_init(strm);
  if (strm_local._4_4_ == LZMA_OK) {
    strm_local._4_4_ =
         lzma_stream_encoder_init
                   ((lzma_next_coder_conflict2 *)strm->internal,strm->allocator,filters,check);
    if (strm_local._4_4_ == LZMA_OK) {
      strm->internal->supported_actions[0] = true;
      strm->internal->supported_actions[1] = true;
      strm->internal->supported_actions[2] = true;
      strm->internal->supported_actions[3] = true;
      strm_local._4_4_ = LZMA_OK;
    }
    else {
      lzma_end(strm);
    }
  }
  return strm_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_encoder(lzma_stream *strm,
		const lzma_filter *filters, lzma_check check)
{
	lzma_next_strm_init2(lzma_stream_encoder_init, strm, filters, check);

	strm->internal->supported_actions[LZMA_RUN] = true;
	strm->internal->supported_actions[LZMA_SYNC_FLUSH] = true;
	strm->internal->supported_actions[LZMA_FULL_FLUSH] = true;
	strm->internal->supported_actions[LZMA_FINISH] = true;

	return LZMA_OK;
}